

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O3

_Bool al_save_sample_f(ALLEGRO_FILE *fp,char *ident,ALLEGRO_SAMPLE *spl)

{
  _Bool _Var1;
  char cVar2;
  ACODEC_TABLE *pAVar3;
  
  pAVar3 = find_acodec_table_entry(ident);
  if ((pAVar3 != (ACODEC_TABLE *)0x0) &&
     (pAVar3->fs_saver != (_func__Bool_ALLEGRO_FILE_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) {
    _Var1 = (*pAVar3->fs_saver)(fp,spl);
    return _Var1;
  }
  cVar2 = _al_trace_prefix("audio",3,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                           ,0x185,"al_save_sample_f");
  if (cVar2 != '\0') {
    _al_trace_suffix("No handler for audio file extension %s.\n",ident);
  }
  return false;
}

Assistant:

bool al_save_sample_f(ALLEGRO_FILE *fp, const char *ident, ALLEGRO_SAMPLE *spl)
{
   ACODEC_TABLE *ent;

   ASSERT(fp);
   ASSERT(ident);
   
   ent = find_acodec_table_entry(ident);
   if (ent && ent->fs_saver) {
      return (ent->fs_saver)(fp, spl);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s.\n", ident);
   }

   return false;
}